

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmTest * __thiscall cmMakefile::CreateTest(cmMakefile *this,string *testName)

{
  __uniq_ptr_impl<cmTest,_std::default_delete<cmTest>_> __p;
  _Head_base<0UL,_cmTest_*,_false> _Var1;
  __uniq_ptr_impl<cmTest,_std::default_delete<cmTest>_> *this_00;
  __single_object newTest;
  __uniq_ptr_impl<cmTest,_std::default_delete<cmTest>_> local_28;
  cmMakefile *local_20;
  
  _Var1._M_head_impl = GetTest(this,testName);
  if (_Var1._M_head_impl == (cmTest *)0x0) {
    local_20 = this;
    std::make_unique<cmTest,cmMakefile*>((cmMakefile **)&local_28);
    _Var1._M_head_impl =
         (cmTest *)
         local_28._M_t.super__Tuple_impl<0UL,_cmTest_*,_std::default_delete<cmTest>_>.
         super__Head_base<0UL,_cmTest_*,_false>._M_head_impl;
    cmTest::SetName((cmTest *)
                    local_28._M_t.super__Tuple_impl<0UL,_cmTest_*,_std::default_delete<cmTest>_>.
                    super__Head_base<0UL,_cmTest_*,_false>._M_head_impl,testName);
    this_00 = (__uniq_ptr_impl<cmTest,_std::default_delete<cmTest>_> *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmTest,_std::default_delete<cmTest>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmTest,_std::default_delete<cmTest>_>_>_>_>
              ::operator[](&this->Tests,testName);
    __p._M_t.super__Tuple_impl<0UL,_cmTest_*,_std::default_delete<cmTest>_>.
    super__Head_base<0UL,_cmTest_*,_false>._M_head_impl =
         local_28._M_t.super__Tuple_impl<0UL,_cmTest_*,_std::default_delete<cmTest>_>.
         super__Head_base<0UL,_cmTest_*,_false>._M_head_impl;
    local_28._M_t.super__Tuple_impl<0UL,_cmTest_*,_std::default_delete<cmTest>_>.
    super__Head_base<0UL,_cmTest_*,_false>._M_head_impl =
         (tuple<cmTest_*,_std::default_delete<cmTest>_>)
         (_Tuple_impl<0UL,_cmTest_*,_std::default_delete<cmTest>_>)0x0;
    std::__uniq_ptr_impl<cmTest,_std::default_delete<cmTest>_>::reset
              (this_00,(pointer)__p._M_t.
                                super__Tuple_impl<0UL,_cmTest_*,_std::default_delete<cmTest>_>.
                                super__Head_base<0UL,_cmTest_*,_false>._M_head_impl);
    std::unique_ptr<cmTest,_std::default_delete<cmTest>_>::~unique_ptr
              ((unique_ptr<cmTest,_std::default_delete<cmTest>_> *)&local_28);
  }
  return _Var1._M_head_impl;
}

Assistant:

cmTest* cmMakefile::CreateTest(const std::string& testName)
{
  cmTest* test = this->GetTest(testName);
  if (test) {
    return test;
  }
  auto newTest = cm::make_unique<cmTest>(this);
  test = newTest.get();
  newTest->SetName(testName);
  this->Tests[testName] = std::move(newTest);
  return test;
}